

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O2

void Am_Register_Timer(Am_Time *wait_time,Am_Object *obj,Am_Slot_Key method_slot,bool once)

{
  Am_Interactor_Time_Event *this;
  Am_Object AStack_38;
  Am_Time local_30;
  
  this = (Am_Interactor_Time_Event *)operator_new(0x28);
  Am_Time::Am_Time(&local_30,wait_time);
  Am_Object::Am_Object(&AStack_38,obj);
  Am_Interactor_Time_Event::Am_Interactor_Time_Event(this,&local_30,&AStack_38,method_slot,once);
  Am_Object::~Am_Object(&AStack_38);
  Am_Time::~Am_Time(&local_30);
  am_add_timing_event(this);
  return;
}

Assistant:

void
Am_Register_Timer(Am_Time wait_time, Am_Object obj, Am_Slot_Key method_slot,
                  bool once)
{
  Am_Interactor_Time_Event *new_event =
      new Am_Interactor_Time_Event(wait_time, obj, method_slot, once);
  am_add_timing_event(new_event);
}